

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testYca.cpp
# Opt level: O3

void anon_unknown.dwarf_33eb38::fillPixelsColor(Array2D<Imf_3_2::Rgba> *pixels,int w,int h)

{
  Rgba *pRVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  char cVar5;
  long lVar6;
  ushort uVar7;
  float fVar8;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  float fVar13;
  float fVar14;
  ulong local_60;
  
  if (0 < h) {
    lVar12 = 0;
    local_60 = 0;
    do {
      if (0 < w) {
        dVar2 = (double)(int)local_60;
        uVar10 = 0;
        do {
          lVar11 = pixels->_sizeY;
          pRVar1 = pixels->_data;
          dVar3 = (double)(int)uVar10;
          dVar4 = sin(dVar3 * 0.05);
          fVar13 = (float)(dVar4 * 0.5 + 0.8);
          fVar8 = ABS(fVar13);
          uVar7 = (ushort)((uint)fVar13 >> 0x10) & 0x8000;
          if ((uint)fVar8 < 0x38800000) {
            if ((0x33000000 < (uint)fVar8) &&
               (uVar9 = (uint)fVar8 & 0x7fffff | 0x800000, cVar5 = (char)((uint)fVar8 >> 0x17),
               uVar7 = uVar7 | (ushort)(uVar9 >> (0x7eU - cVar5 & 0x1f)),
               0x80000000 < uVar9 << (cVar5 + 0xa2U & 0x1f))) {
              uVar7 = uVar7 + 1;
            }
          }
          else if ((uint)fVar8 < 0x7f800000) {
            if ((uint)fVar8 < 0x477ff000) {
              uVar7 = (ushort)((int)fVar8 + 0x8000fff + (uint)(((uint)fVar8 >> 0xd & 1) != 0) >> 0xd
                              ) | uVar7;
            }
            else {
              uVar7 = uVar7 | 0x7c00;
            }
          }
          else {
            uVar7 = uVar7 | 0x7c00;
            if (fVar8 != INFINITY) {
              uVar9 = (uint)fVar8 >> 0xd & 0x3ff;
              uVar7 = uVar7 | (ushort)uVar9 | (ushort)(uVar9 == 0);
            }
          }
          lVar11 = lVar11 * lVar12;
          *(ushort *)((long)&pRVar1[uVar10].r._h + lVar11) = uVar7;
          dVar4 = sin(dVar3 * 0.02 + dVar2 * 0.02);
          fVar13 = (float)(dVar4 * 0.5 + 0.8);
          fVar8 = ABS(fVar13);
          uVar7 = (ushort)((uint)fVar13 >> 0x10) & 0x8000;
          if ((uint)fVar8 < 0x38800000) {
            if ((0x33000000 < (uint)fVar8) &&
               (uVar9 = (uint)fVar8 & 0x7fffff | 0x800000, cVar5 = (char)((uint)fVar8 >> 0x17),
               uVar7 = uVar7 | (ushort)(uVar9 >> (0x7eU - cVar5 & 0x1f)),
               0x80000000 < uVar9 << (cVar5 + 0xa2U & 0x1f))) {
              uVar7 = uVar7 + 1;
            }
          }
          else if ((uint)fVar8 < 0x7f800000) {
            if ((uint)fVar8 < 0x477ff000) {
              uVar7 = (ushort)((int)fVar8 + 0x8000fff + (uint)(((uint)fVar8 >> 0xd & 1) != 0) >> 0xd
                              ) | uVar7;
            }
            else {
              uVar7 = uVar7 | 0x7c00;
            }
          }
          else {
            uVar7 = uVar7 | 0x7c00;
            if (fVar8 != INFINITY) {
              uVar9 = (uint)fVar8 >> 0xd & 0x3ff;
              uVar7 = uVar7 | (ushort)uVar9 | (ushort)(uVar9 == 0);
            }
          }
          *(ushort *)((long)&pRVar1[uVar10].g._h + lVar11) = uVar7;
          dVar4 = sin(dVar2 * 0.03);
          fVar13 = (float)(dVar4 * 0.5 + 0.8);
          fVar8 = ABS(fVar13);
          uVar7 = (ushort)((uint)fVar13 >> 0x10) & 0x8000;
          if ((uint)fVar8 < 0x38800000) {
            if ((0x33000000 < (uint)fVar8) &&
               (uVar9 = (uint)fVar8 & 0x7fffff | 0x800000, cVar5 = (char)((uint)fVar8 >> 0x17),
               uVar7 = uVar7 | (ushort)(uVar9 >> (0x7eU - cVar5 & 0x1f)),
               0x80000000 < uVar9 << (cVar5 + 0xa2U & 0x1f))) {
              uVar7 = uVar7 + 1;
            }
          }
          else if ((uint)fVar8 < 0x7f800000) {
            if ((uint)fVar8 < 0x477ff000) {
              uVar7 = (ushort)((int)fVar8 + 0x8000fff + (uint)(((uint)fVar8 >> 0xd & 1) != 0) >> 0xd
                              ) | uVar7;
            }
            else {
              uVar7 = uVar7 | 0x7c00;
            }
          }
          else {
            uVar7 = uVar7 | 0x7c00;
            if (fVar8 != INFINITY) {
              uVar9 = (uint)fVar8 >> 0xd & 0x3ff;
              uVar7 = uVar7 | (ushort)uVar9 | (ushort)(uVar9 == 0);
            }
          }
          *(ushort *)((long)&pRVar1[uVar10].b._h + lVar11) = uVar7;
          dVar3 = sin(dVar3 * 0.05 + dVar2 * -0.05);
          lVar6 = _imath_half_to_float_table;
          fVar13 = (float)(dVar3 * 0.5 + 0.8);
          fVar14 = *(float *)(_imath_half_to_float_table +
                             (ulong)*(uint16_t *)((long)&pRVar1[uVar10].r._h + lVar11) * 4) * fVar13
          ;
          fVar8 = ABS(fVar14);
          uVar7 = (ushort)((uint)fVar14 >> 0x10) & 0x8000;
          if ((uint)fVar8 < 0x38800000) {
            if ((0x33000000 < (uint)fVar8) &&
               (uVar9 = (uint)fVar8 & 0x7fffff | 0x800000, cVar5 = (char)((uint)fVar8 >> 0x17),
               uVar7 = uVar7 | (ushort)(uVar9 >> (0x7eU - cVar5 & 0x1f)),
               0x80000000 < uVar9 << (cVar5 + 0xa2U & 0x1f))) {
              uVar7 = uVar7 + 1;
            }
          }
          else if ((uint)fVar8 < 0x7f800000) {
            if ((uint)fVar8 < 0x477ff000) {
              uVar7 = (ushort)((int)fVar8 + 0x8000fff + (uint)(((uint)fVar8 >> 0xd & 1) != 0) >> 0xd
                              ) | uVar7;
            }
            else {
              uVar7 = uVar7 | 0x7c00;
            }
          }
          else {
            uVar7 = uVar7 | 0x7c00;
            if (fVar8 != INFINITY) {
              uVar9 = (uint)fVar8 >> 0xd & 0x3ff;
              uVar7 = uVar7 | (ushort)uVar9 | (ushort)(uVar9 == 0);
            }
          }
          *(ushort *)((long)&pRVar1[uVar10].r._h + lVar11) = uVar7;
          fVar14 = *(float *)(lVar6 + (ulong)*(uint16_t *)((long)&pRVar1[uVar10].g._h + lVar11) * 4)
                   * fVar13;
          fVar8 = ABS(fVar14);
          uVar7 = (ushort)((uint)fVar14 >> 0x10) & 0x8000;
          if ((uint)fVar8 < 0x38800000) {
            if ((0x33000000 < (uint)fVar8) &&
               (uVar9 = (uint)fVar8 & 0x7fffff | 0x800000, cVar5 = (char)((uint)fVar8 >> 0x17),
               uVar7 = uVar7 | (ushort)(uVar9 >> (0x7eU - cVar5 & 0x1f)),
               0x80000000 < uVar9 << (cVar5 + 0xa2U & 0x1f))) {
              uVar7 = uVar7 + 1;
            }
          }
          else if ((uint)fVar8 < 0x7f800000) {
            if ((uint)fVar8 < 0x477ff000) {
              uVar7 = (ushort)((int)fVar8 + 0x8000fff + (uint)(((uint)fVar8 >> 0xd & 1) != 0) >> 0xd
                              ) | uVar7;
            }
            else {
              uVar7 = uVar7 | 0x7c00;
            }
          }
          else {
            uVar7 = uVar7 | 0x7c00;
            if (fVar8 != INFINITY) {
              uVar9 = (uint)fVar8 >> 0xd & 0x3ff;
              uVar7 = uVar7 | (ushort)uVar9 | (ushort)(uVar9 == 0);
            }
          }
          *(ushort *)((long)&pRVar1[uVar10].g._h + lVar11) = uVar7;
          fVar14 = *(float *)(lVar6 + (ulong)*(uint16_t *)((long)&pRVar1[uVar10].b._h + lVar11) * 4)
                   * fVar13;
          fVar8 = ABS(fVar14);
          uVar7 = (ushort)((uint)fVar14 >> 0x10) & 0x8000;
          if ((uint)fVar8 < 0x38800000) {
            if ((0x33000000 < (uint)fVar8) &&
               (uVar9 = (uint)fVar8 & 0x7fffff | 0x800000, cVar5 = (char)((uint)fVar8 >> 0x17),
               uVar7 = uVar7 | (ushort)(uVar9 >> (0x7eU - cVar5 & 0x1f)),
               0x80000000 < uVar9 << (cVar5 + 0xa2U & 0x1f))) {
              uVar7 = uVar7 + 1;
            }
          }
          else if ((uint)fVar8 < 0x7f800000) {
            if ((uint)fVar8 < 0x477ff000) {
              uVar7 = (ushort)((int)fVar8 + 0x8000fff + (uint)(((uint)fVar8 >> 0xd & 1) != 0) >> 0xd
                              ) | uVar7;
            }
            else {
              uVar7 = uVar7 | 0x7c00;
            }
          }
          else {
            uVar7 = uVar7 | 0x7c00;
            if (fVar8 != INFINITY) {
              uVar9 = (uint)fVar8 >> 0xd & 0x3ff;
              uVar7 = uVar7 | (ushort)uVar9 | (ushort)(uVar9 == 0);
            }
          }
          *(ushort *)((long)&pRVar1[uVar10].b._h + lVar11) = uVar7;
          fVar8 = ABS(fVar13);
          uVar7 = (ushort)((uint)fVar13 >> 0x10) & 0x8000;
          if ((uint)fVar8 < 0x38800000) {
            if ((0x33000000 < (uint)fVar8) &&
               (uVar9 = (uint)fVar8 & 0x7fffff | 0x800000, cVar5 = (char)((uint)fVar8 >> 0x17),
               uVar7 = uVar7 | (ushort)(uVar9 >> (0x7eU - cVar5 & 0x1f)),
               0x80000000 < uVar9 << (cVar5 + 0xa2U & 0x1f))) {
              uVar7 = uVar7 + 1;
            }
          }
          else if ((uint)fVar8 < 0x7f800000) {
            if ((uint)fVar8 < 0x477ff000) {
              uVar7 = (ushort)((int)fVar8 + 0x8000fff + (uint)(((uint)fVar8 >> 0xd & 1) != 0) >> 0xd
                              ) | uVar7;
            }
            else {
              uVar7 = uVar7 | 0x7c00;
            }
          }
          else {
            uVar7 = uVar7 | 0x7c00;
            if (fVar8 != INFINITY) {
              uVar9 = (uint)fVar8 >> 0xd & 0x3ff;
              uVar7 = uVar7 | (ushort)uVar9 | (ushort)(uVar9 == 0);
            }
          }
          *(ushort *)((long)&pRVar1[uVar10].a._h + lVar11) = uVar7;
          uVar10 = uVar10 + 1;
        } while ((uint)w != uVar10);
      }
      local_60 = local_60 + 1;
      lVar12 = lVar12 + 8;
    } while (local_60 != (uint)h);
  }
  return;
}

Assistant:

void
fillPixelsColor (Array2D<Rgba>& pixels, int w, int h)
{
    for (int y = 0; y < h; ++y)
    {
        for (int x = 0; x < w; ++x)
        {
            Rgba& p = pixels[y][x];

            p.r = 0.8 + 0.5 * sin (x * 0.05);
            p.g = 0.8 + 0.5 * sin (x * 0.02 + y * 0.02);
            p.b = 0.8 + 0.5 * sin (y * 0.03);

            float t = 0.8 + 0.5 * sin (x * 0.05 - y * 0.05);

            p.r *= t;
            p.g *= t;
            p.b *= t;
            p.a = t;
        }
    }
}